

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_get_distribution_type(Integer g_a,char *type)

{
  undefined8 uVar1;
  
  switch(GA[g_a + 1000].distr_type) {
  case 0:
    uVar1 = 0x72616c75676572;
    break;
  case 1:
    builtin_strncpy(type + 5,"_cyclic",8);
    uVar1 = 0x79635f6b636f6c62;
    break;
  case 2:
    builtin_strncpy(type,"scalapack",10);
    return;
  case 3:
    builtin_strncpy(type,"tiled",6);
    return;
  case 4:
    builtin_strncpy(type,"tiled_irreg",0xc);
    return;
  default:
    uVar1 = 0x6e776f6e6b6e75;
  }
  *(undefined8 *)type = uVar1;
  return;
}

Assistant:

void pnga_get_distribution_type(Integer g_a, char *type)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer itype = GA[ga_handle].distr_type;
  if (itype == REGULAR) {
    strcpy(type,"regular");
  } else if (itype == BLOCK_CYCLIC) {
    strcpy(type,"block_cyclic");
  } else if (itype == SCALAPACK) {
    strcpy(type,"scalapack");
  } else if (itype == TILED) {
    strcpy(type,"tiled");
  } else if (itype == TILED_IRREG) {
    strcpy(type,"tiled_irreg");
  } else {
    strcpy(type,"unknown");
  }
}